

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::emplace<QTextLayout::FormatRange_const&>
          (QMovableArrayOps<QTextLayout::FormatRange> *this,qsizetype i,FormatRange *args)

{
  FormatRange **ppFVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_70;
  undefined1 *local_48;
  undefined1 auStack_40 [16];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
           super_QArrayDataPointer<QTextLayout::FormatRange>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
        super_QArrayDataPointer<QTextLayout::FormatRange>.size == i) {
      qVar4 = QArrayDataPointer<QTextLayout::FormatRange>::freeSpaceAtEnd
                        ((QArrayDataPointer<QTextLayout::FormatRange> *)this);
      if (qVar4 == 0) goto LAB_00391ff9;
      QTextLayout::FormatRange::FormatRange
                ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.ptr +
                 (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                 super_QArrayDataPointer<QTextLayout::FormatRange>.size,args);
LAB_003920f4:
      pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                super_QArrayDataPointer<QTextLayout::FormatRange>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_003920b1;
    }
LAB_00391ff9:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QTextLayout::FormatRange>::freeSpaceAtBegin
                        ((QArrayDataPointer<QTextLayout::FormatRange> *)this);
      if (qVar4 != 0) {
        QTextLayout::FormatRange::FormatRange
                  ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                   super_QArrayDataPointer<QTextLayout::FormatRange>.ptr + -1,args);
        ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
                   super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
        *ppFVar1 = *ppFVar1 + -1;
        goto LAB_003920f4;
      }
    }
  }
  auStack_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  auStack_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextLayout::FormatRange::FormatRange((FormatRange *)&local_48,args);
  bVar5 = (this->super_QGenericArrayOps<QTextLayout::FormatRange>).
          super_QArrayDataPointer<QTextLayout::FormatRange>.size != 0;
  QArrayDataPointer<QTextLayout::FormatRange>::detachAndGrow
            ((QArrayDataPointer<QTextLayout::FormatRange> *)this,(uint)(i == 0 && bVar5),1,
             (FormatRange **)0x0,(QArrayDataPointer<QTextLayout::FormatRange> *)0x0);
  if (i == 0 && bVar5) {
    QTextLayout::FormatRange::FormatRange
              ((this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr + -1,(FormatRange *)&local_48);
    ppFVar1 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
               super_QArrayDataPointer<QTextLayout::FormatRange>.ptr;
    *ppFVar1 = *ppFVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QTextLayout::FormatRange>).
              super_QArrayDataPointer<QTextLayout::FormatRange>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QTextLayout::FormatRange> *)this,i,1);
    QTextLayout::FormatRange::FormatRange(local_70.displaceFrom,(FormatRange *)&local_48);
    local_70.displaceFrom = local_70.displaceFrom + 1;
    Inserter::~Inserter(&local_70);
  }
  QTextFormat::~QTextFormat((QTextFormat *)auStack_40);
LAB_003920b1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }